

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
ExceptionOr<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>::
~ExceptionOr(ExceptionOr<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
             *this)

{
  ExceptionOr<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  *this_local;
  
  Maybe<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>::
  ~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}